

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O2

pair<bool,_std::pair<imrt::Station_*,_int>_> * __thiscall
imrt::Plan::getLSBeamlet
          (pair<bool,_std::pair<imrt::Station_*,_int>_> *__return_storage_ptr__,Plan *this,int bsize
          ,int vsize)

{
  _Base_ptr p_Var1;
  int iVar2;
  iterator it;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  _Base_ptr local_50;
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  local_48;
  
  EvaluationFunction::best_beamlets
            ((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
              *)&local_48,this->ev,this,bsize,vsize,0);
  local_50 = local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar2 = rand();
  std::
  __advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,long>
            (&local_50,(ulong)(long)iVar2 % local_48._M_impl.super__Rb_tree_header._M_node_count);
  __return_storage_ptr__->first = *(bool *)&local_50[1]._M_parent;
  p_Var1 = local_50[1]._M_right;
  (__return_storage_ptr__->second).first = (Station *)local_50[1]._M_left;
  *(_Base_ptr *)&(__return_storage_ptr__->second).second = p_Var1;
  std::
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::~_Rb_tree(&local_48);
  return __return_storage_ptr__;
}

Assistant:

virtual pair<bool, pair<Station*, int>> getLSBeamlet(int bsize, int vsize){
		  auto sb=ev.best_beamlets(*this, bsize, vsize);
		  auto it=sb.begin();
		  std::advance(it,rand()%sb.size());
		  return make_pair(it->first.second, it->second);
	}